

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index)

{
  uint32_t uVar1;
  VmaBlockMetadata *pVVar2;
  VmaDeviceMemoryBlock *pVVar3;
  VmaBlockMetadata *pVVar4;
  VmaDefragmentationMove *pVVar5;
  VmaDeviceMemoryBlock *pVVar6;
  undefined6 uVar7;
  bool bVar8;
  byte bVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  VkResult VVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t sVar14;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  VmaAllocationCreateFlags VVar18;
  long lVar19;
  byte *pbVar20;
  ulong uVar21;
  int iVar22;
  size_t sVar23;
  bool bVar24;
  bool bStack_d1;
  size_t sStack_d0;
  VkDeviceSize VStack_c0;
  VkDeviceSize VStack_b8;
  VmaSuballocationType VStack_b0;
  VmaAllocationCreateFlags VStack_ac;
  VmaDefragmentationMoveOperation VStack_a8;
  undefined4 uStack_a4;
  VmaAllocation pVStack_a0;
  VmaAllocation pVVar25;
  undefined8 uStack_88;
  byte *pbStack_80;
  VmaDeviceMemoryBlock *pVStack_78;
  undefined8 uStack_70;
  undefined1 auStack_68 [16];
  VmaRawList<VmaSuballocation> *pVStack_58;
  undefined8 uStack_50;
  void *pvStack_48;
  uint64_t uStack_40;
  ulong uStack_38;
  undefined4 extraout_var_05;
  
  uVar1 = this->m_Algorithm;
  if (uVar1 == 8) {
code_r0x001c0cbe:
    if (vector->m_BufferImageGranularity == 1) {
      bVar8 = ComputeDefragmentation_Full(this,vector);
      return bVar8;
    }
    pbVar20 = (byte *)((long)this->m_AlgorithmState + index * 0x10);
    bVar11 = false;
    bVar24 = false;
    uStack_88._0_6_ = (uint6)uStack_88 & 0xffffffffff;
    uStack_88 = (VkDeviceSize)(uint6)uStack_88;
    bVar8 = false;
    switch(*(undefined1 *)((long)this->m_AlgorithmState + index * 0x10)) {
    case 0:
    case 1:
    case 2:
      sVar23 = *(size_t *)(pbVar20 + 8);
      if (sVar23 == 0xffffffffffffffff) {
        sVar23 = (vector->m_Blocks).m_Count;
      }
      else if (sVar23 == 0) {
        *pbVar20 = 6;
        bVar8 = ComputeDefragmentation_Fast(this,vector);
        return bVar8;
      }
      pVStack_78 = (VmaDeviceMemoryBlock *)(sVar23 - 1);
      pVVar2 = (vector->m_Blocks).m_pArray[sVar23 - 1]->m_pMetadata;
      uStack_70 = (this->m_Moves).m_Count;
      pVStack_a0 = (VmaAllocation)0x1c0da0;
      pbStack_80 = pbVar20;
      auStack_68._0_8_ = index;
      iVar12 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
      lVar19 = CONCAT44(extraout_var_08,iVar12);
      pbVar20 = pbStack_80;
      goto joined_r0x001c0da3;
    case 3:
switchD_001c0d34_caseD_3:
      pVStack_a0 = (VmaAllocation)0x1c1006;
      bVar24 = MoveDataToFreeBlocks
                         (this,VMA_SUBALLOCATION_TYPE_BUFFER,vector,*(size_t *)(pbVar20 + 8),
                          (bool *)((long)&uStack_88 + 7),(bool *)((long)&uStack_88 + 6),
                          (bool *)((long)&uStack_88 + 5));
      bVar8 = bVar11;
      if (!bVar24) goto switchD_001c0d34_caseD_6;
      if (uStack_88._6_1_ != '\x01') {
        if (uStack_88._5_1_ != '\x01') goto LAB_001c1072;
        *pbVar20 = 5;
        uStack_88._0_6_ = (uint6)(uint5)uStack_88;
        goto switchD_001c0d34_caseD_5;
      }
      break;
    case 4:
      pVStack_a0 = (VmaAllocation)0x1c0f4d;
      bVar24 = MoveDataToFreeBlocks
                         (this,VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL,vector,*(size_t *)(pbVar20 + 8),
                          (bool *)((long)&uStack_88 + 7),(bool *)((long)&uStack_88 + 6),
                          (bool *)((long)&uStack_88 + 5));
      bVar8 = bVar11;
      if (!bVar24) goto switchD_001c0d34_caseD_6;
      if (uStack_88._7_1_ != 1) {
        if ((uStack_88._6_1_ != '\0') || (uStack_88._5_1_ == '\x01')) {
          *pbVar20 = 3;
          uVar7 = (uint6)uStack_88;
          uStack_88 = (ulong)uStack_88._7_1_ << 0x38;
          uStack_88 = CONCAT26(uStack_88._6_2_,uVar7) & 0xffff00ffffffffff;
          goto switchD_001c0d34_caseD_3;
        }
        goto LAB_001c1072;
      }
      *pbVar20 = 1;
      goto code_r0x001c0cbe;
    case 5:
switchD_001c0d34_caseD_5:
      pVStack_a0 = (VmaAllocation)0x1c1046;
      bVar24 = MoveDataToFreeBlocks
                         (this,VMA_SUBALLOCATION_TYPE_FREE,vector,*(size_t *)(pbVar20 + 8),
                          (bool *)((long)&uStack_88 + 7),(bool *)((long)&uStack_88 + 6),
                          (bool *)((long)&uStack_88 + 5));
      bVar8 = false;
      if (!bVar24) goto switchD_001c0d34_caseD_6;
      if (uStack_88._5_1_ != '\x01') {
LAB_001c1072:
        *pbVar20 = 6;
        bVar8 = bVar11;
        goto switchD_001c0d34_caseD_6;
      }
      break;
    default:
      goto switchD_001c0d34_caseD_6;
    case 7:
      goto switchD_001c0d34_caseD_7;
    }
    *pbVar20 = 0;
    goto code_r0x001c0cbe;
  }
  if (uVar1 == 4) {
    sStack_d0 = (vector->m_Blocks).m_Count - 1;
    bStack_d1 = this->m_ImmovableBlockCount < sStack_d0;
    if (this->m_ImmovableBlockCount < sStack_d0) {
      do {
        pVVar3 = (vector->m_Blocks).m_pArray[sStack_d0];
        pVVar2 = pVVar3->m_pMetadata;
        iVar12 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
        lVar19 = CONCAT44(extraout_var_02,iVar12);
        pVVar6 = pVStack_78;
        while (pVStack_78 = pVVar3, lVar19 != 0) {
          VStack_a8 = VMA_DEFRAGMENTATION_MOVE_OPERATION_COPY;
          pVStack_a0 = (VmaAllocation)0x0;
          pVVar25 = (VmaAllocation)0x0;
          iVar12 = (*pVVar2->_vptr_VmaBlockMetadata[10])(pVVar2,lVar19);
          pVStack_a0 = (VmaAllocation)CONCAT44(extraout_var_03,iVar12);
          VStack_c0 = pVStack_a0->m_Size;
          VStack_b8 = pVStack_a0->m_Alignment;
          VStack_b0 = (VmaSuballocationType)pVStack_a0->m_SuballocationType;
          VVar18 = (pVStack_a0->m_Flags & 1) * 4;
          VStack_ac = VVar18 + 0xc00;
          if ((pVStack_a0->m_Flags & 2) == 0) {
            VStack_ac = VVar18;
          }
          iVar12 = 7;
          if ((VmaDefragmentationContext_T *)pVStack_a0->m_pUserData != this) {
            iVar17 = 0;
            if (this->m_MaxPassBytes < VStack_c0 + (this->m_PassStats).bytesMoved) {
              bVar9 = this->m_IgnoredAllocs + 1;
              this->m_IgnoredAllocs = bVar9;
              iVar17 = 2 - (uint)(bVar9 < 0x10);
            }
            if (iVar17 != 1) {
              if (iVar17 == 2) {
LAB_001c0aaa:
                iVar12 = 1;
              }
              else {
                sVar23 = (this->m_Moves).m_Count;
                bVar8 = AllocInOtherBlock(this,0,sStack_d0,(MoveAllocationData *)&VStack_c0,vector);
                iVar12 = 1;
                if (!bVar8) {
                  if (pVStack_a0->m_Type == '\x01') {
                    pVVar4 = ((pVStack_a0->field_0).m_BlockAllocation.m_Block)->m_pMetadata;
                    iVar12 = (*pVVar4->_vptr_VmaBlockMetadata[9])
                                       (pVVar4,(pVStack_a0->field_0).m_BlockAllocation.m_AllocHandle
                                       );
                    sVar14 = CONCAT44(extraout_var_05,iVar12);
                  }
                  else {
                    sVar14 = 0;
                  }
                  iVar12 = 0;
                  if (((sVar14 != 0) && (sVar23 == (this->m_Moves).m_Count)) &&
                     (uStack_70 = sVar14, iVar17 = (*pVVar2->_vptr_VmaBlockMetadata[6])(pVVar2),
                     VStack_c0 <= CONCAT44(extraout_var_06,iVar17))) {
                    pvStack_48 = (void *)0x0;
                    uStack_40 = 0;
                    pVStack_58 = (VmaRawList<VmaSuballocation> *)0x0;
                    uStack_50 = (VmaListItem<VmaSuballocation> *)0x0;
                    auStack_68._0_8_ = (VmaAllocHandle)0x0;
                    auStack_68._8_8_ = 0;
                    uStack_38 = uStack_38 & 0xffffffff00000000;
                    pbStack_80 = (byte *)(ulong)VStack_b0;
                    uStack_88 = VStack_b8;
                    iVar17 = (*pVVar2->_vptr_VmaBlockMetadata[0x11])
                                       (pVVar2,VStack_c0,VStack_b8,0,pbStack_80,0x40000,auStack_68);
                    if ((((char)iVar17 != '\0') &&
                        (iVar17 = (*pVVar2->_vptr_VmaBlockMetadata[9])(pVVar2,auStack_68._0_8_),
                        CONCAT44(extraout_var_07,iVar17) < uStack_70)) &&
                       (VVar13 = VmaBlockVector::CommitAllocationRequest
                                           (vector,(VmaAllocationRequest *)auStack_68,pVStack_78,
                                            uStack_88,VStack_ac,this,
                                            (VmaSuballocationType)pbStack_80,
                                            (VmaAllocation *)&stack0xffffffffffffff68), iVar12 = 0,
                       VVar13 == VK_SUCCESS)) {
                      sVar23 = (this->m_Moves).m_Count;
                      VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::
                      resize(&this->m_Moves,sVar23 + 1);
                      pVVar5 = (this->m_Moves).m_pArray;
                      pVVar5[sVar23].dstTmpAllocation = pVVar25;
                      pVVar5 = pVVar5 + sVar23;
                      *(ulong *)pVVar5 = CONCAT44(uStack_a4,VStack_a8);
                      pVVar5->srcAllocation = pVStack_a0;
                      uVar21 = this->m_MaxPassBytes;
                      uVar15 = (this->m_PassStats).bytesMoved + VStack_c0;
                      (this->m_PassStats).bytesMoved = uVar15;
                      uVar16 = (this->m_PassStats).allocationsMoved + 1;
                      (this->m_PassStats).allocationsMoved = uVar16;
                      if ((this->m_MaxPassAllocations <= uVar16) || (uVar21 <= uVar15))
                      goto LAB_001c0aaa;
                    }
                  }
                }
              }
            }
          }
          if ((iVar12 != 7) && (iVar12 != 0)) goto LAB_001c0c7f;
          iVar12 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar19);
          pVVar3 = pVStack_78;
          pVVar6 = pVStack_78;
          lVar19 = CONCAT44(extraout_var_04,iVar12);
        }
        iVar12 = 5;
        pVStack_78 = pVVar6;
LAB_001c0c7f:
        if ((iVar12 != 5) && (iVar12 != 0)) {
          return bStack_d1;
        }
        sStack_d0 = sStack_d0 - 1;
        bStack_d1 = this->m_ImmovableBlockCount < sStack_d0;
      } while (this->m_ImmovableBlockCount < sStack_d0);
    }
    return bStack_d1;
  }
  if (uVar1 != 1) {
    bVar8 = ComputeDefragmentation_Balanced(this,vector,index,true);
    return bVar8;
  }
  sVar23 = (vector->m_Blocks).m_Count - 1;
  uVar21 = this->m_ImmovableBlockCount;
  auStack_68._0_8_ = vector;
  uStack_70._7_1_ = uVar21 < sVar23;
  if (uVar21 < sVar23) {
    do {
      pVVar2 = ((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_> *)
               (auStack_68._0_8_ + 0x90))->m_pArray[sVar23]->m_pMetadata;
      pbStack_80 = (byte *)0x1c0487;
      iVar12 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
      lVar19 = CONCAT44(extraout_var,iVar12);
      while (lVar19 != 0) {
        pvStack_48 = (void *)((ulong)pvStack_48 & 0xffffffff00000000);
        uStack_40 = 0;
        uStack_38 = 0;
        pbStack_80 = (byte *)0x1c04ab;
        iVar12 = (*pVVar2->_vptr_VmaBlockMetadata[10])(pVVar2,lVar19);
        uStack_40 = CONCAT44(extraout_var_00,iVar12);
        auStack_68._8_8_ = *(undefined8 *)(uStack_40 + 0x30);
        pVStack_58 = *(VmaRawList<VmaSuballocation> **)(uStack_40 + 0x28);
        iVar17 = (*(byte *)(uStack_40 + 0x4f) & 1) * 4;
        iVar12 = iVar17 + 0xc00;
        if ((*(byte *)(uStack_40 + 0x4f) & 2) == 0) {
          iVar12 = iVar17;
        }
        uStack_50 = (VmaListItem<VmaSuballocation> *)
                    CONCAT44(iVar12,(uint)*(byte *)(uStack_40 + 0x4d));
        cVar10 = '\a';
        if (*(VmaDefragmentationContext_T **)(uStack_40 + 0x38) != this) {
          iVar12 = 0;
          if (this->m_MaxPassBytes < auStack_68._8_8_ + (this->m_PassStats).bytesMoved) {
            bVar9 = this->m_IgnoredAllocs + 1;
            this->m_IgnoredAllocs = bVar9;
            iVar12 = 2 - (uint)(bVar9 < 0x10);
          }
          if (iVar12 != 1) {
            if (iVar12 == 2) {
              cVar10 = '\x01';
            }
            else {
              pbStack_80 = (byte *)0x1c053c;
              cVar10 = AllocInOtherBlock(this,0,sVar23,(MoveAllocationData *)(auStack_68 + 8),
                                         (VmaBlockVector *)auStack_68._0_8_);
            }
          }
        }
        if ((cVar10 != '\a') && (cVar10 != '\0')) goto LAB_001c0566;
        pbStack_80 = (byte *)0x1c0555;
        iVar12 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar19);
        lVar19 = CONCAT44(extraout_var_01,iVar12);
      }
      cVar10 = '\x05';
LAB_001c0566:
      if ((cVar10 != '\x05') && (cVar10 != '\0')) break;
      sVar23 = sVar23 - 1;
      uStack_70._7_1_ = this->m_ImmovableBlockCount < sVar23;
    } while (this->m_ImmovableBlockCount < sVar23);
  }
  return (bool)(uStack_70._7_1_ & 1);
joined_r0x001c0da3:
  pbStack_80 = pbVar20;
  if (lVar19 == 0) goto LAB_001c0ec2;
  iVar22 = 0;
  pvStack_48 = (void *)((ulong)pvStack_48 & 0xffffffff00000000);
  uStack_40 = 0;
  uStack_38 = 0;
  pVStack_a0 = (VmaAllocation)0x1c0dcc;
  iVar12 = (*pVVar2->_vptr_VmaBlockMetadata[10])(pVVar2,lVar19);
  uStack_40 = CONCAT44(extraout_var_09,iVar12);
  auStack_68._8_8_ = *(undefined8 *)(uStack_40 + 0x30);
  pVStack_58 = *(VmaRawList<VmaSuballocation> **)(uStack_40 + 0x28);
  iVar17 = (*(byte *)(uStack_40 + 0x4f) & 1) * 4;
  iVar12 = iVar17 + 0xc00;
  if ((*(byte *)(uStack_40 + 0x4f) & 2) == 0) {
    iVar12 = iVar17;
  }
  uStack_50 = (VmaListItem<VmaSuballocation> *)CONCAT44(iVar12,(uint)*(byte *)(uStack_40 + 0x4d));
  if (this->m_MaxPassBytes < auStack_68._8_8_ + (this->m_PassStats).bytesMoved) {
    bVar9 = this->m_IgnoredAllocs + 1;
    this->m_IgnoredAllocs = bVar9;
    iVar22 = 2 - (uint)(bVar9 < 0x10);
  }
  if (iVar22 == 1) {
    iVar12 = 5;
  }
  else if (iVar22 == 2) {
    iVar12 = 1;
  }
  else {
    iVar12 = 0;
    pVStack_a0 = (VmaAllocation)0x1c0e5e;
    bVar8 = AllocInOtherBlock(this,0,(size_t)pVStack_78,(MoveAllocationData *)(auStack_68 + 8),
                              vector);
    if ((bVar8) && (iVar12 = 1, uStack_70 != (this->m_Moves).m_Count)) {
      pVStack_a0 = (VmaAllocation)0x1c0e80;
      iVar17 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar19);
      if (CONCAT44(extraout_var_10,iVar17) == 0) {
        *(VmaDeviceMemoryBlock **)((long)this->m_AlgorithmState + auStack_68._0_8_ * 8) = pVStack_78
        ;
      }
    }
  }
  if ((iVar12 != 5) && (iVar12 != 0)) {
    bVar24 = true;
    bVar11 = false;
    pbVar20 = pbStack_80;
    goto LAB_001c0fb1;
  }
  pVStack_a0 = (VmaAllocation)0x1c0eb6;
  iVar12 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar19);
  lVar19 = CONCAT44(extraout_var_11,iVar12);
  pbVar20 = pbStack_80;
  goto joined_r0x001c0da3;
LAB_001c0ec2:
  if (uStack_70 == (this->m_Moves).m_Count) {
    if ((VmaDeviceMemoryBlock *)0x1 < pVStack_78) {
      lVar19 = sVar23 - 2;
      do {
        pVStack_a0 = (VmaAllocation)0x1c0ef8;
        bVar8 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[lVar19]);
        if (bVar8) {
          bVar24 = true;
          goto LAB_001c0fa3;
        }
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
    bVar11 = true;
    bVar24 = true;
    if (uStack_70 != (this->m_Moves).m_Count) goto LAB_001c0fb1;
    pVStack_a0 = (VmaAllocation)0x1c0f24;
    bVar24 = ComputeDefragmentation_Fast(this,vector);
  }
  else {
    bVar9 = 3;
    if (*pbVar20 != 0) {
      bVar9 = *pbVar20 == 2 | 4;
    }
    *pbVar20 = bVar9;
    *(VmaDeviceMemoryBlock **)(pbVar20 + 8) = pVStack_78;
    pVStack_a0 = (VmaAllocation)0x1c0fa1;
    bVar24 = ComputeDefragmentation_Extensive(this,vector,auStack_68._0_8_);
  }
LAB_001c0fa3:
  bVar11 = false;
LAB_001c0fb1:
  bVar8 = bVar24;
  if (bVar11) {
switchD_001c0d34_caseD_6:
    if (*pbVar20 == 6) {
      sVar23 = (this->m_Moves).m_Count;
      bVar24 = (vector->m_Blocks).m_Count != 0;
      if (bVar24) {
        pVStack_a0 = (VmaAllocation)0x1c10a5;
        bVar11 = ReallocWithinBlock(this,vector,*(vector->m_Blocks).m_pArray);
        if (bVar11) {
          bVar8 = true;
        }
        else {
          uVar21 = 1;
          pbStack_80 = pbVar20;
          do {
            bVar24 = uVar21 < (vector->m_Blocks).m_Count;
            pbVar20 = pbStack_80;
            if (!bVar24) goto LAB_001c10eb;
            pVStack_a0 = (VmaAllocation)0x1c10dc;
            bVar11 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[uVar21]);
            uVar21 = uVar21 + 1;
          } while (!bVar11);
          bVar8 = true;
          pbVar20 = pbStack_80;
        }
      }
LAB_001c10eb:
      if (bVar24) {
        return bVar8;
      }
      if (sVar23 == (this->m_Moves).m_Count) {
        *pbVar20 = 7;
      }
    }
    bVar24 = false;
  }
switchD_001c0d34_caseD_7:
  return bVar24;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation(VmaBlockVector& vector, size_t index)
{
    switch (m_Algorithm)
    {
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_FAST_BIT:
        return ComputeDefragmentation_Fast(vector);
    default:
        VMA_ASSERT(0);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_BALANCED_BIT:
        return ComputeDefragmentation_Balanced(vector, index, true);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_FULL_BIT:
        return ComputeDefragmentation_Full(vector);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_EXTENSIVE_BIT:
        return ComputeDefragmentation_Extensive(vector, index);
    }
}